

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTransaction::SetElementsTxState(ConfidentialTransaction *this)

{
  wally_tx *tx;
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  ulong uVar5;
  size_t is_coinbase;
  size_t local_10;
  
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  if (tx != (wally_tx *)0x0) {
    local_10 = 0;
    iVar2 = wally_tx_is_coinbase(tx,&local_10);
    if (((iVar2 == 0) && (local_10 == 0)) && (uVar1 = tx->num_inputs, uVar1 != 0)) {
      puVar3 = &tx->inputs->features;
      uVar4 = 1;
      do {
        if ((*(wally_tx_witness_stack **)(puVar3 + 0x88) == (wally_tx_witness_stack *)0x0) ||
           ((*(wally_tx_witness_stack **)(puVar3 + 0x88))->num_items == 0)) {
          *puVar3 = *puVar3 & 0xfb;
        }
        else {
          *puVar3 = *puVar3 | 4;
        }
        if (((*(uchar **)(puVar3 + 0x48) == (uchar *)0x0) || (*(size_t *)(puVar3 + 0x50) == 0)) &&
           ((*(uchar **)(puVar3 + 0x58) == (uchar *)0x0 || (*(size_t *)(puVar3 + 0x60) == 0)))) {
          *puVar3 = *puVar3 & 0xfd;
        }
        else {
          *puVar3 = *puVar3 | 2;
        }
        uVar5 = (ulong)uVar4;
        puVar3 = puVar3 + 0xd0;
        uVar4 = uVar4 + 1;
      } while (uVar5 < uVar1);
    }
  }
  return;
}

Assistant:

void ConfidentialTransaction::SetElementsTxState() {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    size_t is_coinbase = 0;
    // coinbase priority when coinbase is set
    int ret = wally_tx_is_coinbase(tx_pointer, &is_coinbase);
    if ((ret == WALLY_OK) && (is_coinbase == 0)) {
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        struct wally_tx_input *input = tx_pointer->inputs + i;
        // pegin_witness
        if ((input->pegin_witness != nullptr) &&
            (input->pegin_witness->num_items != 0)) {
          input->features |= kTxInFeaturePegin;
        } else {
          input->features &= ~kTxInFeaturePegin;
        }

        // issuance
        if (((input->issuance_amount != nullptr) &&
             (input->issuance_amount_len != 0)) ||
            ((input->inflation_keys != nullptr) &&
             (input->inflation_keys_len != 0))) {
          input->features |= kTxInFeatureIssuance;
        } else {
          input->features &= ~kTxInFeatureIssuance;
        }
      }
    }
  }
}